

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_json_mapping_api.cpp
# Opt level: O0

string * cfd::api::json::JsonMappingApi::ElementsDecodeRawTransaction(string *request_message)

{
  function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
  *in_RSI;
  string *in_RDI;
  function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
  *in_stack_00000200;
  string *in_stack_00000208;
  
  std::
  function<void(cfd::api::json::ElementsDecodeRawTransactionRequest*,cfd::api::json::ElementsDecodeRawTransactionResponse*)>
  ::
  function<void(&)(cfd::api::json::ElementsDecodeRawTransactionRequest*,cfd::api::json::ElementsDecodeRawTransactionResponse*),void>
            (in_RSI,(_func_void_ElementsDecodeRawTransactionRequest_ptr_ElementsDecodeRawTransactionResponse_ptr
                     *)in_RDI);
  ExecuteDirectApi<cfd::api::json::ElementsDecodeRawTransactionRequest,cfd::api::json::ElementsDecodeRawTransactionResponse>
            (in_stack_00000208,in_stack_00000200);
  std::
  function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
  ::~function((function<void_(cfd::api::json::ElementsDecodeRawTransactionRequest_*,_cfd::api::json::ElementsDecodeRawTransactionResponse_*)>
               *)0x63f63b);
  return in_RDI;
}

Assistant:

std::string JsonMappingApi::ElementsDecodeRawTransaction(
    const std::string &request_message) {
  return ExecuteDirectApi<
      ElementsDecodeRawTransactionRequest,
      ElementsDecodeRawTransactionResponse>(
      request_message, ElementsTransactionJsonApi::DecodeRawTransaction);
}